

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET hal_h265e_vepu511_wait(void *hal,HalEncTask *task)

{
  MppPacket s;
  long lVar1;
  H265eV511RegSet *regs_00;
  undefined4 *param_00;
  uint type_00;
  uint len;
  MPP_RET MVar2;
  size_t sVar3;
  int local_a4;
  RK_S32 i;
  MppDevPollCfg *poll_cfg;
  RK_U32 slice_last;
  RK_U32 slice_len;
  EncOutParam param;
  H265eV511StatusElem *elem;
  RK_U32 type;
  H265eVepu511Frame *reg_frm;
  RK_U32 seg_offset;
  RK_U32 offset;
  H265eV511RegSet *regs;
  Vepu511H265eFrmCfg *frm;
  RK_S32 task_idx;
  RK_U32 split_out;
  MppPacket pkt;
  HalEncTask *enc_task;
  H265eV511HalContext *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  s = task->packet;
  frm._4_4_ = *(uint *)(*(long *)((long)hal + 0x3b0) + 0xe9c);
  lVar1 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  regs_00 = *(H265eV511RegSet **)(lVar1 + 0x18);
  sVar3 = mpp_packet_get_length(s);
  reg_frm._0_4_ = (int)sVar3;
  type_00 = (uint)(regs_00->reg_frm).synt_nal & 0x3f;
  param._16_8_ = *(undefined8 *)(lVar1 + 0x20);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x9f4);
  }
  if ((task->flags).err == 0) {
    if (((task->rc_task->frm).val >> 2 & 1) != 0) {
      frm._4_4_ = 0;
    }
    if (frm._4_4_ == 0) {
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
      if (MVar2 == MPP_OK) {
        ctx._4_4_ = hal_h265e_vepu511_status_check(regs_00);
        if (ctx._4_4_ == MPP_OK) {
          task->hw_length = *(int *)(param._16_8_ + 4) + task->hw_length;
        }
      }
      else {
        _mpp_log_l(2,"hal_h265e_v511","poll cmd failed %d\n","hal_h265e_vepu511_wait",
                   (ulong)(uint)MVar2);
        ctx._4_4_ = MPP_ERR_VPUHW;
      }
      mpp_packet_add_segment_info(s,type_00,(int)reg_frm,*(RK_S32 *)(param._16_8_ + 4));
    }
    else {
      poll_cfg._0_4_ = 0;
      param_00 = *(undefined4 **)((long)hal + 0xa0);
      _slice_last = task;
      param.task = mpp_packet_get_data(task->packet);
      do {
        *param_00 = 0;
        param_00[1] = 0;
        param_00[2] = *(undefined4 *)((long)hal + 0x98);
        param_00[3] = 0;
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,param_00);
        for (local_a4 = 0; local_a4 < (int)param_00[3]; local_a4 = local_a4 + 1) {
          poll_cfg._0_4_ = -((int)param_00[(long)local_a4 + 4] >> 0x1f);
          len = param_00[(long)local_a4 + 4] & 0x7fffffff;
          param.base._4_4_ = len;
          mpp_packet_add_segment_info(s,type_00,(int)reg_frm,len);
          reg_frm._0_4_ = len + (int)reg_frm;
          if ((frm._4_4_ & 1) != 0) {
            if ((int)poll_cfg == 0) {
              *(undefined4 *)(*(long *)((long)hal + 0xa8) + 0x10) = 0x202;
            }
            else {
              *(undefined4 *)(*(long *)((long)hal + 0xa8) + 0x10) = 0x201;
            }
            param.base._4_4_ = len;
            mpp_callback_f("hal_h265e_vepu511_wait",*(MppCbCtx **)((long)hal + 0xa8),&slice_last);
          }
        }
      } while ((int)poll_cfg == 0);
      ctx._4_4_ = hal_h265e_vepu511_status_check(regs_00);
      if (ctx._4_4_ == MPP_OK) {
        task->hw_length = *(int *)(param._16_8_ + 4) + task->hw_length;
      }
    }
    if (ctx._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v511","poll cmd failed %d status %d \n","hal_h265e_vepu511_wait",
                 (ulong)(uint)ctx._4_4_,(ulong)*(uint *)param._16_8_);
    }
    if ((hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0xa3c);
    }
    hal_local._4_4_ = ctx._4_4_;
  }
  else {
    _mpp_log_l(2,"hal_h265e_v511","enc_task->flags.err %08x, return early","hal_h265e_vepu511_wait",
               (ulong)(task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_vepu511_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    HalEncTask *enc_task = task;
    MppPacket pkt = enc_task->packet;
    RK_U32 split_out = ctx->cfg->split.split_out;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu511H265eFrmCfg *frm = ctx->frms[task_idx];
    H265eV511RegSet *regs = frm->regs_set;
    RK_U32 offset = mpp_packet_get_length(pkt);
    RK_U32 seg_offset = offset;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    RK_U32 type = reg_frm->synt_nal.nal_unit_type;
    H265eV511StatusElem *elem = (H265eV511StatusElem *)frm->regs_ret;

    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (enc_task->rc_task->frm.save_pass1)
        split_out = 0;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len = 0;
        RK_U32 slice_last = 0;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs);
        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            RK_S32 i = 0;
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);
            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;
                param.length = slice_len;

                mpp_packet_add_segment_info(pkt, type, seg_offset, slice_len);
                seg_offset += slice_len;

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) {
                    param.length = slice_len;
                    if (slice_last)
                        ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                    else
                        ctx->output_cb->cmd = ENC_OUTPUT_SLICE;

                    mpp_callback(ctx->output_cb, &param);
                }
            }
        } while (!slice_last);

        ret = hal_h265e_vepu511_status_check(regs);
        if (!ret)
            task->hw_length += elem->st.bs_lgth_l32;

    } else {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret) {
            mpp_err_f("poll cmd failed %d\n", ret);
            ret = MPP_ERR_VPUHW;
        } else {
            ret = hal_h265e_vepu511_status_check(regs);
            if (!ret)
                task->hw_length += elem->st.bs_lgth_l32;
        }
        mpp_packet_add_segment_info(pkt, type, offset, elem->st.bs_lgth_l32);
    }

#ifdef DUMP_DATA
    vepu511_h265e_dump(ctx, task);
#endif

    if (ret)
        mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);

    hal_h265e_leave();
    return ret;
}